

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

ostream * mjs::operator<<(ostream *os,token_type t)

{
  ostream *poVar1;
  char *pcVar2;
  
  switch(t) {
  case whitespace:
    pcVar2 = "whitespace";
    break;
  case line_terminator:
    pcVar2 = "line_terminator";
    break;
  case identifier:
    pcVar2 = "identifier";
    break;
  case numeric_literal:
    pcVar2 = "numeric_literal";
    break;
  case string_literal:
    pcVar2 = "string_literal";
    break;
  case rshiftshiftequal:
    pcVar2 = "rshiftshiftequal";
    break;
  case rshiftshift:
    pcVar2 = "rshiftshift";
    break;
  case lshiftequal:
    pcVar2 = "lshiftequal";
    break;
  case rshiftequal:
    pcVar2 = "rshiftequal";
    break;
  case equalequalequal:
    pcVar2 = "equalequalequal";
    break;
  case notequalequal:
    pcVar2 = "notequalequal";
    break;
  case equalequal:
    pcVar2 = "equalequal";
    break;
  case notequal:
    pcVar2 = "notequal";
    break;
  case ltequal:
    pcVar2 = "ltequal";
    break;
  case gtequal:
    pcVar2 = "gtequal";
    break;
  case andand:
    pcVar2 = "andand";
    break;
  case oror:
    pcVar2 = "oror";
    break;
  case plusplus:
    pcVar2 = "plusplus";
    break;
  case minusminus:
    pcVar2 = "minusminus";
    break;
  case lshift:
    pcVar2 = "lshift";
    break;
  case rshift:
    pcVar2 = "rshift";
    break;
  case plusequal:
    pcVar2 = "plusequal";
    break;
  case minusequal:
    pcVar2 = "minusequal";
    break;
  case multiplyequal:
    pcVar2 = "multiplyequal";
    break;
  case divideequal:
    pcVar2 = "divideequal";
    break;
  case andequal:
    pcVar2 = "andequal";
    break;
  case orequal:
    pcVar2 = "orequal";
    break;
  case xorequal:
    pcVar2 = "xorequal";
    break;
  case modequal:
    pcVar2 = "modequal";
    break;
  case equal:
    pcVar2 = "equal";
    break;
  case gt:
    pcVar2 = "gt";
    break;
  case lt:
    pcVar2 = "lt";
    break;
  case comma:
    pcVar2 = "comma";
    break;
  case not_:
    pcVar2 = "not_";
    break;
  case tilde:
    pcVar2 = "tilde";
    break;
  case question:
    pcVar2 = "question";
    break;
  case colon:
    pcVar2 = "colon";
    break;
  case dot:
    pcVar2 = "dot";
    break;
  case plus:
    pcVar2 = "plus";
    break;
  case minus:
    pcVar2 = "minus";
    break;
  case multiply:
    pcVar2 = "multiply";
    break;
  case divide:
    pcVar2 = "divide";
    break;
  case and_:
    pcVar2 = "and_";
    break;
  case or_:
    pcVar2 = "or_";
    break;
  case xor_:
    pcVar2 = "xor_";
    break;
  case mod:
    pcVar2 = "mod";
    break;
  case lparen:
    pcVar2 = "lparen";
    break;
  case rparen:
    pcVar2 = "rparen";
    break;
  case lbrace:
    pcVar2 = "lbrace";
    break;
  case rbrace:
    pcVar2 = "rbrace";
    break;
  case lbracket:
    pcVar2 = "lbracket";
    break;
  case rbracket:
    pcVar2 = "rbracket";
    break;
  case semicolon:
    pcVar2 = "semicolon";
    break;
  case abstract_:
    pcVar2 = "abstract";
    break;
  case boolean_:
    pcVar2 = "boolean";
    break;
  case break_:
    pcVar2 = "break";
    break;
  case byte_:
    pcVar2 = "byte";
    break;
  case case_:
    pcVar2 = "case";
    break;
  case catch_:
    pcVar2 = "catch";
    break;
  case char_:
    pcVar2 = "char";
    break;
  case class_:
    pcVar2 = "class";
    break;
  case const_:
    pcVar2 = "const";
    break;
  case continue_:
    pcVar2 = "continue";
    break;
  case debugger_:
    pcVar2 = "debugger";
    break;
  case default_:
    pcVar2 = "default";
    break;
  case delete_:
    pcVar2 = "delete";
    break;
  case do_:
    pcVar2 = "do";
    break;
  case double_:
    pcVar2 = "double";
    break;
  case else_:
    pcVar2 = "else";
    break;
  case enum_:
    pcVar2 = "enum";
    break;
  case export_:
    pcVar2 = "export";
    break;
  case extends_:
    pcVar2 = "extends";
    break;
  case false_:
    pcVar2 = "false";
    break;
  case final_:
    pcVar2 = "final";
    break;
  case finally_:
    pcVar2 = "finally";
    break;
  case float_:
    pcVar2 = "float";
    break;
  case for_:
    pcVar2 = "for";
    break;
  case function_:
    pcVar2 = "function";
    break;
  case goto_:
    pcVar2 = "goto";
    break;
  case if_:
    pcVar2 = "if";
    break;
  case implements_:
    pcVar2 = "implements";
    break;
  case import_:
    pcVar2 = "import";
    break;
  case in_:
    pcVar2 = "in";
    break;
  case instanceof_:
    pcVar2 = "instanceof";
    break;
  case int_:
    pcVar2 = "int";
    break;
  case interface_:
    pcVar2 = "interface";
    break;
  case let_:
    pcVar2 = "let";
    break;
  case long_:
    pcVar2 = "long";
    break;
  case native_:
    pcVar2 = "native";
    break;
  case new_:
    pcVar2 = "new";
    break;
  case null_:
    pcVar2 = "null";
    break;
  case package_:
    pcVar2 = "package";
    break;
  case private_:
    pcVar2 = "private";
    break;
  case protected_:
    pcVar2 = "protected";
    break;
  case public_:
    pcVar2 = "public";
    break;
  case return_:
    pcVar2 = "return";
    break;
  case short_:
    pcVar2 = "short";
    break;
  case static_:
    pcVar2 = "static";
    break;
  case super_:
    pcVar2 = "super";
    break;
  case switch_:
    pcVar2 = "switch";
    break;
  case synchronized_:
    pcVar2 = "synchronized";
    break;
  case this_:
    pcVar2 = "this";
    break;
  case throw_:
    pcVar2 = "throw";
    break;
  case throws_:
    pcVar2 = "throws";
    break;
  case transient_:
    pcVar2 = "transient";
    break;
  case true_:
    pcVar2 = "true";
    break;
  case try_:
    pcVar2 = "try";
    break;
  case typeof_:
    pcVar2 = "typeof";
    break;
  case var_:
    pcVar2 = "var";
    break;
  case void_:
    pcVar2 = "void";
    break;
  case volatile_:
    pcVar2 = "volatile";
    break;
  case while_:
    pcVar2 = "while";
    break;
  case with_:
    pcVar2 = "with";
    break;
  case yield_:
    pcVar2 = "yield";
    break;
  case eof:
    pcVar2 = "eof";
    break;
  default:
    poVar1 = std::operator<<(os,"token_type{");
    os = (ostream *)std::ostream::operator<<((ostream *)poVar1,t);
    pcVar2 = "}";
  }
  poVar1 = std::operator<<(os,pcVar2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, token_type t) {
    switch (t) {
#define CASE_TOKEN_TYPE(n) case token_type::n: return os << #n;
        CASE_TOKEN_TYPE(whitespace)
        CASE_TOKEN_TYPE(line_terminator)
        CASE_TOKEN_TYPE(identifier)
        CASE_TOKEN_TYPE(numeric_literal)
        CASE_TOKEN_TYPE(string_literal)
        CASE_TOKEN_TYPE(eof)
#undef CASE_TOKEN_TYPE
#define CASE_PUNCTUATOR(n, ...) case token_type::n: return os << #n;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
#define CASE_KEYWORD(n, ...) case token_type::n ## _: return os << #n;
        MJS_KEYWORDS(CASE_KEYWORD)
#undef CASE_KEYWORD
    }
    return os << "token_type{" << (int)t << "}";
}